

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  basic_suite::run();
  small_suite::run();
  int8_suite::run();
  int16_suite::run();
  int32_suite::run();
  int64_suite::run();
  float32_suite::run();
  float64_suite::run();
  container_suite::run();
  string8_suite::run();
  string16_suite::run();
  string32_suite::run();
  string64_suite::run();
  compact_int8_suite::run();
  compact_int16_suite::run();
  compact_int32_suite::run();
  compact_int64_suite::run();
  compact_float32_suite::run();
  compact_float64_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    basic_suite::run();
    small_suite::run();
    int8_suite::run();
    int16_suite::run();
    int32_suite::run();
    int64_suite::run();
    float32_suite::run();
    float64_suite::run();
    container_suite::run();
    string8_suite::run();
    string16_suite::run();
    string32_suite::run();
    string64_suite::run();
    compact_int8_suite::run();
    compact_int16_suite::run();
    compact_int32_suite::run();
    compact_int64_suite::run();
    compact_float32_suite::run();
    compact_float64_suite::run();

    return boost::report_errors();
}